

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O1

LY_ERR lyb_write(ly_out *out,uint8_t *buf,size_t count,lylyb_ctx *lybctx)

{
  LY_ERR LVar1;
  lyd_lyb_sibling *plVar2;
  ulong uVar3;
  lyd_lyb_sibling *plVar4;
  ulong uVar5;
  lyd_lyb_sibling *plVar6;
  size_t len;
  undefined2 local_44;
  uint16_t local_42;
  lylyb_ctx *local_40;
  uint8_t *local_38;
  
  local_40 = lybctx;
  local_38 = buf;
  while( true ) {
    do {
      plVar2 = lybctx->siblings;
      uVar3 = 0;
      plVar6 = (lyd_lyb_sibling *)0x0;
      plVar4 = plVar2;
      len = count;
      while( true ) {
        if (plVar2 == (lyd_lyb_sibling *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(ulong *)&plVar2[-1].inner_chunks;
        }
        if (uVar5 <= uVar3) break;
        if (0xfffe < plVar4->written + len) {
          len = 0xffff - plVar4->written;
          plVar6 = plVar4;
        }
        uVar3 = uVar3 + 1;
        plVar4 = plVar4 + 1;
      }
      if ((plVar6 == (lyd_lyb_sibling *)0x0) && (count == 0)) {
        return LY_SUCCESS;
      }
      if (len != 0) {
        LVar1 = ly_write_(out,(char *)local_38,len);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        plVar2 = local_40->siblings;
        uVar3 = 0xffffffffffffffff;
        plVar4 = plVar2;
        while( true ) {
          if (plVar2 == (lyd_lyb_sibling *)0x0) {
            uVar5 = 0;
          }
          else {
            uVar5 = *(ulong *)&plVar2[-1].inner_chunks;
          }
          uVar3 = uVar3 + 1;
          if (uVar5 <= uVar3) break;
          uVar5 = plVar4->written + len;
          plVar4->written = uVar5;
          plVar4 = plVar4 + 1;
          if (0xffff < uVar5) {
            __assert_fail("lybctx->siblings[u].written <= LYB_SIZE_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c"
                          ,0x131,
                          "LY_ERR lyb_write(struct ly_out *, const uint8_t *, size_t, struct lylyb_ctx *)"
                         );
          }
        }
        count = count - len;
        local_38 = local_38 + len;
        lybctx = local_40;
      }
    } while (plVar6 == (lyd_lyb_sibling *)0x0);
    local_44 = (undefined2)plVar6->written;
    local_42 = plVar6->inner_chunks;
    LVar1 = ly_write_skipped(out,plVar6->position,(char *)&local_44,4);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    plVar6->written = 0;
    plVar6->inner_chunks = 0;
    LVar1 = ly_write_skip(out,4,&plVar6->position);
    if (LVar1 != LY_SUCCESS) break;
    for (plVar2 = local_40->siblings; lybctx = local_40, plVar2 != plVar6; plVar2 = plVar2 + 1) {
      if (plVar2->inner_chunks == 0xffff) {
        ly_log(local_40->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c"
               ,0x146);
        return LY_EINT;
      }
      plVar2->inner_chunks = plVar2->inner_chunks + 1;
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyb_write(struct ly_out *out, const uint8_t *buf, size_t count, struct lylyb_ctx *lybctx)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lyd_lyb_sibling *full, *iter;
    size_t to_write;

    while (1) {
        /* check for full data chunks */
        to_write = count;
        full = NULL;
        LY_ARRAY_FOR(lybctx->siblings, u) {
            /* we want the innermost chunks resolved first, so replace previous full chunks */
            if (lybctx->siblings[u].written + to_write >= LYB_SIZE_MAX) {
                /* full chunk, do not write more than allowed */
                to_write = LYB_SIZE_MAX - lybctx->siblings[u].written;
                full = &lybctx->siblings[u];
            }
        }

        if (!full && !count) {
            break;
        }

        /* we are actually writing some data, not just finishing another chunk */
        if (to_write) {
            LY_CHECK_RET(ly_write_(out, (char *)buf, to_write));

            LY_ARRAY_FOR(lybctx->siblings, u) {
                /* increase all written counters */
                lybctx->siblings[u].written += to_write;
                assert(lybctx->siblings[u].written <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= to_write;
            buf += to_write;
        }

        if (full) {
            /* write the meta information (inner chunk count and chunk size) */
            LY_CHECK_RET(lyb_write_sibling_meta(out, full));

            /* zero written and inner chunks */
            full->written = 0;
            full->inner_chunks = 0;

            /* skip space for another chunk size */
            LY_CHECK_RET(ly_write_skip(out, LYB_META_BYTES, &full->position));

            /* increase inner chunk count */
            for (iter = &lybctx->siblings[0]; iter != full; ++iter) {
                if (iter->inner_chunks == LYB_INCHUNK_MAX) {
                    LOGINT(lybctx->ctx);
                    return LY_EINT;
                }
                ++iter->inner_chunks;
            }
        }
    }

    return LY_SUCCESS;
}